

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds01_pair_sum.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  mapped_type *pmVar2;
  iterator iVar3;
  char *__s;
  key_type *pkVar4;
  int i;
  long lVar5;
  bool bVar6;
  undefined8 uStack_90;
  key_type akStack_88 [2];
  undefined1 local_80 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mi;
  int local_40;
  int local_3c;
  int m;
  int tgt;
  int n;
  
  uStack_90 = 0x101236;
  __isoc99_scanf("%d%d",&tgt,&local_40);
  lVar1 = -((ulong)(uint)tgt * 4 + 0xf & 0xfffffffffffffff0);
  pkVar4 = (key_type *)((long)akStack_88 + lVar1);
  mi._M_t._M_impl._0_4_ = 0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mi;
  mi._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&mi;
  mi._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pkVar4;
  for (lVar5 = 0; lVar5 < tgt; lVar5 = lVar5 + 1) {
    *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x101292;
    __isoc99_scanf("%d",pkVar4);
    *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x10129d;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)local_80,pkVar4);
    *pmVar2 = *pmVar2 + 1;
    pkVar4 = pkVar4 + 1;
  }
  do {
    bVar6 = local_40 == 0;
    local_40 = local_40 + -1;
    if (bVar6) {
      *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x101337;
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                   *)local_80);
      return 0;
    }
    *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x1012c8;
    __isoc99_scanf("%d",&local_3c);
    pkVar4 = (key_type *)mi._M_t._M_impl.super__Rb_tree_header._M_node_count;
    for (lVar5 = 0; lVar5 < tgt; lVar5 = lVar5 + 1) {
      if (*pkVar4 * 2 == local_3c) {
        *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x1012f1;
        iVar3 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)local_80,pkVar4);
        if (1 < *(int *)&iVar3._M_node[1].field_0x4) {
LAB_00101320:
          __s = "YES";
          goto LAB_00101327;
        }
      }
      else {
        m = local_3c - *pkVar4;
        *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x101309;
        iVar3 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                        *)local_80,&m);
        if (iVar3._M_node != (_Base_ptr)&mi) goto LAB_00101320;
      }
      pkVar4 = pkVar4 + 1;
    }
    __s = "NO";
LAB_00101327:
    *(undefined8 *)((long)akStack_88 + lVar1 + -8) = 0x10132c;
    puts(__s);
  } while( true );
}

Assistant:

int main() {
    int n, m;
    scanf("%d%d", &n, &m);
    int arr[n];
    map<int, int> mi;
    for (int i = 0; i < n; ++i) {
        scanf("%d", &arr[i]);
        mi[arr[i]]++;
    }
wl:
    while (m--) {
        int tgt;
        scanf("%d", &tgt);
        for (int i = 0; i < n; ++i) {
            if (2 * arr[i] == tgt) {
                if (mi.find(arr[i])->second > 1) {
                    printf("YES\n");
                    goto wl;
                }
            } else if (mi.find(tgt - arr[i]) != mi.end()) {
                printf("YES\n");
                goto wl;
            }
        }
        printf("NO\n");
    }
}